

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O2

lyd_diff_userord *
lyd_diff_userord_get(lyd_node *first,lysc_node *schema,lyd_diff_userord **userord)

{
  lyd_diff_userord *plVar1;
  lyd_node **pplVar2;
  long lVar3;
  lyd_node *in_RAX;
  lyd_diff_userord *plVar4;
  long *plVar5;
  lyd_node *plVar6;
  long *plVar7;
  lyd_diff_userord *plVar8;
  long lVar9;
  lyd_diff_userord *plVar10;
  lyd_node *iter;
  
  plVar8 = *userord;
  iter = in_RAX;
  if (plVar8 == (lyd_diff_userord *)0x0) {
    plVar5 = (long *)malloc(0x20);
    if (plVar5 == (long *)0x0) {
LAB_001196f1:
      plVar10 = (lyd_diff_userord *)0x0;
      ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lyd_diff_userord_get");
    }
    else {
      *plVar5 = 1;
      lVar9 = 1;
LAB_00119615:
      *userord = (lyd_diff_userord *)(plVar5 + 1);
      plVar7 = plVar5 + lVar9 * 3;
      plVar10 = (lyd_diff_userord *)(plVar7 + -2);
      plVar10->schema = schema;
      plVar7[-1] = 0;
      *plVar7 = 0;
      if (first != (lyd_node *)0x0) {
        plVar5 = plVar5 + lVar9 * 3;
        plVar6 = lyd_first_sibling(first);
        lyd_find_sibling_val(plVar6,first->schema,(char *)0x0,0,&iter);
        while ((plVar6 = iter, iter != (lyd_node *)0x0 && (iter->schema == first->schema))) {
          lVar9 = *plVar5;
          if (lVar9 != 0) {
            lVar3 = *(long *)(lVar9 + -8);
            *(long *)(lVar9 + -8) = lVar3 + 1;
            plVar7 = (long *)realloc((void *)(lVar9 + -8),lVar3 * 8 + 0x10);
            if (plVar7 != (long *)0x0) {
              lVar9 = *plVar7;
              plVar6 = iter;
              goto LAB_001196cd;
            }
            plVar8 = (lyd_diff_userord *)*plVar5;
LAB_001196ed:
            plVar8[-1].inst = (lyd_node **)((long)plVar8[-1].inst + -1);
            goto LAB_001196f1;
          }
          plVar7 = (long *)malloc(0x10);
          if (plVar7 == (long *)0x0) goto LAB_001196f1;
          *plVar7 = 1;
          lVar9 = 1;
LAB_001196cd:
          *plVar5 = (long)(plVar7 + 1);
          plVar7[lVar9] = (long)plVar6;
          iter = plVar6->next;
        }
      }
    }
  }
  else {
    pplVar2 = plVar8[-1].inst;
    lVar9 = (long)pplVar2 + 1;
    plVar4 = plVar8 + -1;
    do {
      lVar9 = lVar9 + -1;
      if (lVar9 == 0) {
        plVar8[-1].inst = (lyd_node **)((long)pplVar2 + 1);
        plVar5 = (long *)realloc(&plVar8[-1].inst,(long)pplVar2 * 0x18 + 0x20);
        if (plVar5 == (long *)0x0) {
          plVar8 = *userord;
          goto LAB_001196ed;
        }
        lVar9 = *plVar5;
        goto LAB_00119615;
      }
      plVar10 = plVar4 + 1;
      plVar1 = plVar4 + 1;
      plVar4 = plVar10;
    } while (plVar1->schema != schema);
  }
  return plVar10;
}

Assistant:

static struct lyd_diff_userord *
lyd_diff_userord_get(const struct lyd_node *first, const struct lysc_node *schema, struct lyd_diff_userord **userord)
{
    struct lyd_diff_userord *item;
    struct lyd_node *iter;
    const struct lyd_node **node;
    LY_ARRAY_COUNT_TYPE u;

    LY_ARRAY_FOR(*userord, u) {
        if ((*userord)[u].schema == schema) {
            return &(*userord)[u];
        }
    }

    /* it was not added yet, add it now */
    LY_ARRAY_NEW_RET(schema->module->ctx, *userord, item, NULL);

    item->schema = schema;
    item->pos = 0;
    item->inst = NULL;

    /* store all the instance pointers in the current order */
    if (first) {
        LYD_LIST_FOR_INST(lyd_first_sibling(first), first->schema, iter) {
            LY_ARRAY_NEW_RET(schema->module->ctx, item->inst, node, NULL);
            *node = iter;
        }
    }

    return item;
}